

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O3

rgb __thiscall baryonyx::colormap::operator()(colormap *this,longdouble v_)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = this->m_lower;
  auVar1 = vmaxss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)(float)v_));
  auVar1 = vminss_avx(ZEXT416((uint)this->m_upper),auVar1);
  fVar2 = this->m_upper - fVar6;
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3e800000),0),ZEXT416((uint)fVar2),ZEXT416((uint)fVar6))
  ;
  fVar7 = auVar1._0_4_;
  if (auVar3._0_4_ <= fVar7) {
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar2),
                             ZEXT416((uint)fVar6));
    if (auVar1._0_4_ <= fVar7) {
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f400000),0),ZEXT416((uint)fVar2),
                               ZEXT416((uint)fVar6));
      if (auVar1._0_4_ <= fVar7) {
        bVar4 = 0xff;
        fVar6 = ((auVar1._0_4_ - fVar7) * 4.0) / fVar2 + 1.0;
      }
      else {
        auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 - fVar6)),ZEXT416((uint)fVar2),
                                 ZEXT416(0xbf000000));
        bVar4 = (byte)(int)(((auVar1._0_4_ * 4.0) / fVar2) * 255.0);
        fVar6 = 1.0;
      }
      uVar5 = 0;
    }
    else {
      bVar4 = 0;
      fVar6 = 1.0;
      uVar5 = (uint)((((auVar3._0_4_ - fVar7) * 4.0) / fVar2 + 1.0) * 255.0);
    }
  }
  else {
    uVar5 = 0xff;
    bVar4 = 0;
    fVar6 = ((fVar7 - fVar6) * 4.0) / fVar2;
  }
  return (rgb)((uint3)bVar4 |
              (uint3)(((int)(fVar6 * 255.0) & 0xffU) << 8) | (uint3)((uVar5 & 0xff) << 0x10));
}

Assistant:

rgb operator()(T v_) noexcept
    {
        float v = static_cast<float>(v_);

        if (v < m_lower)
            v = m_lower;

        if (v > m_upper)
            v = m_upper;

        float dv = m_upper - m_lower;
        float r = 1.f, g = 1.f, b = 1.f;

        if (v < (m_lower + 0.25f * dv)) {
            r = 0.f;
            g = 4.f * (v - m_lower) / dv;
        } else if (v < (m_lower + 0.5f * dv)) {
            r = 0.f;
            b = 1.f + 4.f * (m_lower + 0.25f * dv - v) / dv;
        } else if (v < (m_lower + 0.75f * dv)) {
            r = 4.f * (v - m_lower - 0.5f * dv) / dv;
            b = 0.f;
        } else {
            g = 1.f + 4.f * (m_lower + 0.75f * dv - v) / dv;
            b = 0.f;
        }

        return rgb(static_cast<std::uint8_t>(r * 255.f),
                   static_cast<std::uint8_t>(g * 255.f),
                   static_cast<std::uint8_t>(b * 255.f));
    }